

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void readDependenciesFromFiles
               (Options *options,QList<QtDependency> *files,QSet<QString> *usedDependencies,
               QSet<QString> *remainingDependencies)

{
  QString *key;
  FILE *pFVar1;
  bool bVar2;
  char cVar3;
  QList<QtDependency> *this;
  char *pcVar4;
  long lVar5;
  QtDependency *fileName;
  QtDependency *args;
  long in_FS_OFFSET;
  QLatin1String QVar6;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args = (files->d).ptr;
  lVar5 = (files->d).size * 0x30;
  do {
    if (lVar5 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    key = &args->absolutePath;
    bVar2 = QHash<QString,_QHashDummyValue>::contains(&usedDependencies->q_hash,key);
    if (!bVar2) {
      QVar6.m_data = (char *)0x3;
      QVar6.m_size = (qsizetype)key;
      cVar3 = QString::endsWith(QVar6,0x1392e4);
      if (cVar3 != '\0') {
        bVar2 = readDependenciesFromElf(options,key,usedDependencies,remainingDependencies);
        pFVar1 = _stdout;
        if (!bVar2) {
          QString::toLocal8Bit((QByteArray *)&local_50,&args->relativePath);
          pcVar4 = local_50.ptr;
          if (local_50.ptr == (char *)0x0) {
            pcVar4 = (char *)&QByteArray::_empty;
          }
          fprintf(pFVar1,"Skipping file dependency: %s\n",pcVar4);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
          goto LAB_00115310;
        }
      }
      QSet<QString>::insert((QSet<QString> *)&local_50,(QString *)usedDependencies);
      pFVar1 = _stdout;
      if (options->verbose == true) {
        QString::toLocal8Bit((QByteArray *)&local_50,&args->relativePath);
        pcVar4 = local_50.ptr;
        if (local_50.ptr == (char *)0x0) {
          pcVar4 = (char *)&QByteArray::_empty;
        }
        fprintf(pFVar1,"Appending file dependency: %s\n",pcVar4);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      }
      this = QHash<QString,_QList<QtDependency>_>::operator[]
                       (&options->qtDependencies,&options->currentArchitecture);
      QList<QtDependency>::emplaceBack<QtDependency_const&>(this,args);
    }
LAB_00115310:
    args = args + 1;
    lVar5 = lVar5 + -0x30;
  } while( true );
}

Assistant:

void readDependenciesFromFiles(Options *options, const QList<QtDependency> &files,
                               QSet<QString> &usedDependencies,
                               QSet<QString> &remainingDependencies)
{
    for (const QtDependency &fileName : files) {
        if (usedDependencies.contains(fileName.absolutePath))
            continue;

        if (fileName.absolutePath.endsWith(".so"_L1)) {
            if (!readDependenciesFromElf(options, fileName.absolutePath, &usedDependencies,
                                         &remainingDependencies)) {
                fprintf(stdout, "Skipping file dependency: %s\n",
                        qPrintable(fileName.relativePath));
                continue;
            }
        }
        usedDependencies.insert(fileName.absolutePath);

        if (options->verbose) {
            fprintf(stdout, "Appending file dependency: %s\n", qPrintable(fileName.relativePath));
        }

        options->qtDependencies[options->currentArchitecture].append(fileName);
    }
}